

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivially_serializable.cpp
# Opt level: O1

void __thiscall handlegraph::TriviallySerializable::serialize(TriviallySerializable *this,int fd)

{
  int local_2c;
  int *local_28;
  undefined8 uStack_20;
  code *local_18;
  code *pcStack_10;
  
  local_28 = &local_2c;
  uStack_20 = 0;
  pcStack_10 = std::
               _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/trivially_serializable.cpp:21:15)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/trivially_serializable.cpp:21:15)>
             ::_M_manager;
  local_2c = fd;
  (*(this->super_Serializable)._vptr_Serializable[0xc])();
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void TriviallySerializable::serialize(int fd) const {
    serialize([&](const void* start, size_t length) {
        // Copy each block to the fd
        size_t written = 0;
        while (written != length) {
            // Bang on the write call until it is all written
            auto result = write(fd, (const void*)((const char*) start + written), length - written);
            if (result == -1) {
                // Can't write at all, something broke.
                throw std::runtime_error("Could not write!");
            }
            written += result;
        }
    });
}